

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_emulation.h
# Opt level: O2

bool std::__equal<false>::
     equal<flatbuffers::internal::SpanIterator<MyGame::Example::TestEnum_const>,flatbuffers::internal::SpanIterator<MyGame::Example::TestEnum>>
               (SpanIterator<const_MyGame::Example::TestEnum> __first1,
               SpanIterator<const_MyGame::Example::TestEnum> __last1,
               SpanIterator<MyGame::Example::TestEnum> __first2)

{
  for (; (__first1.ptr_ != __last1.ptr_ && (*__first1.ptr_ == *__first2.ptr_));
      __first1.ptr_ = __first1.ptr_ + 1) {
    __first2.ptr_ = __first2.ptr_ + 1;
  }
  return __first1.ptr_ == __last1.ptr_;
}

Assistant:

bool operator== (const SpanIterator& lhs, const SpanIterator& rhs) { return lhs.ptr_ == rhs.ptr_; }